

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

AddrInfo * __thiscall AddrManImpl::Find(AddrManImpl *this,CService *addr,nid_type *pnId)

{
  long lVar1;
  bool bVar2;
  reference ppVar3;
  _Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *__x;
  reference ppVar4;
  long *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  iterator it2;
  iterator it;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_CService,_long>,_false> *in_stack_ffffffffffffffa8;
  AddrInfo *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,(AnnotatedMixin<std::mutex> *)0xee3fa7);
  std::
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  ::find(in_stack_ffffffffffffffa0,
         (key_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  ::end(in_stack_ffffffffffffffa0);
  bVar2 = std::__detail::operator==
                    (in_stack_ffffffffffffffa8,
                     (_Node_iterator_base<std::pair<const_CService,_long>,_false> *)
                     in_stack_ffffffffffffffa0);
  if (bVar2) {
    local_30 = (AddrInfo *)0x0;
  }
  else {
    if (in_RDX != (long *)0x0) {
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_CService,_long>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_CService,_long>,_false,_false> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      *in_RDX = ppVar3->second;
    }
    __x = (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)(in_RDI + 0xd8);
    std::__detail::_Node_iterator<std::pair<const_CService,_long>,_false,_false>::operator*
              ((_Node_iterator<std::pair<const_CService,_long>,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            *)in_stack_ffffffffffffffa0,
           (key_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)in_stack_ffffffffffffffa0);
    bVar2 = std::__detail::operator==
                      (__x,(_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                           in_stack_ffffffffffffffa0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_30 = (AddrInfo *)0x0;
    }
    else {
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_30 = &ppVar4->second;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo* AddrManImpl::Find(const CService& addr, nid_type* pnId)
{
    AssertLockHeld(cs);

    const auto it = mapAddr.find(addr);
    if (it == mapAddr.end())
        return nullptr;
    if (pnId)
        *pnId = (*it).second;
    const auto it2 = mapInfo.find((*it).second);
    if (it2 != mapInfo.end())
        return &(*it2).second;
    return nullptr;
}